

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf16sDfa.h
# Opt level: O3

Utf16sDfaBase<axl::enc::Utf16sDfaTable> __thiscall
axl::enc::Utf16sDfaBase<axl::enc::Utf16sDfaTable>::decode
          (Utf16sDfaBase<axl::enc::Utf16sDfaTable> *this,uchar_t c)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  
  bVar1 = Utf16sDfaTable::m_dfa
          [(uint)(byte)Utf16CcMap::m_map[CONCAT71(in_register_00000031,c) & 0xffffffff] +
           (this->super_Utf16sDfaTable).super_UtfDfa<axl::enc::Utf16sDfaTable,_axl::enc::Utf16CcMap>
           .m_state];
  uVar2 = (this->super_Utf16sDfaTable).super_UtfDfa<axl::enc::Utf16sDfaTable,_axl::enc::Utf16CcMap>.
          m_cp;
  iVar4 = (int)CONCAT71(in_register_00000031,c);
  if ((ulong)bVar1 < 0x11) {
    uVar5 = (ulong)(iVar4 << 0x10 | uVar2 & 0xffff);
  }
  else {
    uVar3 = (ushort)(iVar4 << 8) | (ushort)(uVar2 >> 0x10);
    if (bVar1 == 0x28) {
      uVar5 = (ulong)((int)(short)uVar3 + (uVar2 & 0xffff) * 0x400 + 0xfca02400);
    }
    else {
      uVar5 = (ulong)(uint)(int)(short)uVar3;
    }
  }
  return (Utf16sDfaBase<axl::enc::Utf16sDfaTable>)(uVar5 << 0x20 | (ulong)bVar1);
}

Assistant:

Utf16sDfaBase<DfaTable>
Utf16sDfaBase<DfaTable>::decode(uchar_t c) {
	uint_t cc = DfaTable::m_map[c];
	uint_t nextState = DfaTable::m_dfa[this->m_state + cc];
	utf32_t cp = this->m_cp;

	if (nextState <= DfaTable::State_LastHalf) { // half of the next code-unit
		cp &= 0x0000ffff; // use this byte for storage: 0x00ff0000
		cp |= c << 16;
	} else {
		utf16_t cu = DfaTable::IsBigEndian ?
			((cp >> 8) & 0xff00) | c :
			(cp >> 16) | (c << 8);

		cp = nextState == DfaTable::State_ReadyPair ? DfaTable::IsReverse ?
			0x10000 - (0xd800 << 10) - 0xdc00 + (cu << 10) + (cp & 0xffff) :
			0x10000 - (0xd800 << 10) - 0xdc00 + ((cp & 0xffff) << 10) + cu :
			cu;
	}

	return Utf16sDfaBase<DfaTable>(nextState, cp);
}